

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteDataSegment(WatWriter *this,DataSegment *segment)

{
  string_view str;
  Index IVar1;
  uchar *data;
  size_type length;
  DataSegment *segment_local;
  WatWriter *this_local;
  
  WriteOpenSpace(this,"data");
  str = (string_view)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)&segment->name);
  WriteNameOrIndex(this,str,this->data_segment_index_,Space);
  if (segment->kind != Passive) {
    IVar1 = Module::GetMemoryIndex((this->super_ModuleContext).module,&segment->memory_var);
    if (IVar1 != 0) {
      WriteOpenSpace(this,"memory");
      WriteVar(this,&segment->memory_var,Space);
      WriteCloseSpace(this);
    }
    WriteInitExpr(this,&segment->offset);
  }
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&segment->data);
  length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&segment->data);
  WriteQuotedData(this,data,length);
  WriteCloseNewline(this);
  this->data_segment_index_ = this->data_segment_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteDataSegment(const DataSegment& segment) {
  WriteOpenSpace("data");
  WriteNameOrIndex(segment.name, data_segment_index_, NextChar::Space);
  if (segment.kind != SegmentKind::Passive) {
    if (module.GetMemoryIndex(segment.memory_var) != 0) {
      WriteOpenSpace("memory");
      WriteVar(segment.memory_var, NextChar::Space);
      WriteCloseSpace();
    }
    WriteInitExpr(segment.offset);
  }
  WriteQuotedData(segment.data.data(), segment.data.size());
  WriteCloseNewline();
  data_segment_index_++;
}